

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void gen_codes(ct_data *tree,int max_code,uint16_t *bl_count)

{
  ushort uVar1;
  uint16_t uVar2;
  uint len_00;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int len;
  int n;
  int bits;
  uint code;
  uint16_t next_code [16];
  int local_44;
  int local_40;
  ushort auStack_38 [22];
  int local_c;
  long local_8;
  
  uVar1 = 0;
  for (local_40 = 1; local_40 < 0x10; local_40 = local_40 + 1) {
    uVar1 = (uVar1 + *(short *)(in_RDX + (long)(local_40 + -1) * 2)) * 2;
    auStack_38[local_40] = uVar1;
  }
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_44 = 0; local_44 <= local_c; local_44 = local_44 + 1) {
    len_00 = (uint)*(ushort *)(local_8 + 2 + (long)local_44 * 4);
    if (len_00 != 0) {
      uVar1 = auStack_38[(int)len_00];
      auStack_38[(int)len_00] = uVar1 + 1;
      uVar2 = zng_bi_reverse((uint)uVar1,len_00);
      *(uint16_t *)(local_8 + (long)local_44 * 4) = uVar2;
    }
  }
  return;
}

Assistant:

Z_INTERNAL void gen_codes(ct_data *tree, int max_code, uint16_t *bl_count) {
    /* tree: the tree to decorate */
    /* max_code: largest code with non zero frequency */
    /* bl_count: number of codes at each bit length */
    uint16_t next_code[MAX_BITS+1];  /* next code value for each bit length */
    unsigned int code = 0;           /* running code value */
    int bits;                        /* bit index */
    int n;                           /* code index */

    /* The distribution counts are first used to generate the code values
     * without bit reversal.
     */
    for (bits = 1; bits <= MAX_BITS; bits++) {
        code = (code + bl_count[bits-1]) << 1;
        next_code[bits] = (uint16_t)code;
    }
    /* Check that the bit counts in bl_count are consistent. The last code
     * must be all ones.
     */
    Assert(code + bl_count[MAX_BITS]-1 == (1 << MAX_BITS)-1, "inconsistent bit counts");
    Tracev((stderr, "\ngen_codes: max_code %d ", max_code));

    for (n = 0;  n <= max_code; n++) {
        int len = tree[n].Len;
        if (len == 0)
            continue;
        /* Now reverse the bits */
        tree[n].Code = PREFIX(bi_reverse)(next_code[len]++, len);

        Tracecv(tree != static_ltree, (stderr, "\nn %3d %c l %2d c %4x (%x) ",
             n, (isgraph(n & 0xff) ? n : ' '), len, tree[n].Code, next_code[len]-1));
    }
}